

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

void visuals_flicker_free(visuals_flicker *table)

{
  visuals_flicker *table_local;
  
  if (table != (visuals_flicker *)0x0) {
    if (table->cycles != (uint8_t *)0x0) {
      mem_free(table->cycles);
      table->cycles = (uint8_t *)0x0;
    }
    mem_free(table);
  }
  return;
}

Assistant:

static void visuals_flicker_free(struct visuals_flicker *table)
{
	if (table == NULL) {
		return;
	}

	if (table->cycles != NULL) {
		mem_free(table->cycles);
		table->cycles = NULL;
	}

	mem_free(table);
	table = NULL;
}